

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_catalog_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ViewCatalogEntry::AlterEntry(ViewCatalogEntry *this,ClientContext *context,AlterInfo *info)

{
  size_t __n;
  _func_int **pp_Var1;
  int iVar2;
  reference pvVar3;
  pointer pCVar4;
  reference this_00;
  CatalogException *this_01;
  InternalException *this_02;
  BinderException *this_03;
  long in_RCX;
  size_type __n_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  allocator_type local_c9;
  string local_c8;
  long local_a0;
  Value *local_98;
  __node_base *local_90;
  size_t local_88;
  __node_base_ptr p_Stack_80;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(char *)(in_RCX + 9) == '\x02') {
    if (*(char *)(in_RCX + 0x71) != '\x01') {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Unrecognized alter view type!","");
      InternalException::InternalException(this_02,&local_c8);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->config).home_directory._M_dataplus)(this,context);
    pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                         *)this);
    ::std::__cxx11::string::_M_assign((string *)&pCVar4->name);
  }
  else {
    if (*(char *)(in_RCX + 9) != '\b') {
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Can only modify view with ALTER VIEW statement","");
      CatalogException::CatalogException(this_01,&local_c8);
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->config).home_directory._M_dataplus)(this,context);
    bVar6 = (_Hash_node_base *)(context->config).set_variables._M_h._M_element_count ==
            (context->config).set_variables._M_h._M_before_begin._M_nxt;
    bVar5 = !bVar6;
    local_a0 = in_RCX;
    if (bVar6) {
      bVar6 = false;
    }
    else {
      local_90 = &(context->config).set_variables._M_h._M_before_begin;
      local_98 = (Value *)(in_RCX + 0x98);
      bVar6 = false;
      __n_00 = 0;
      do {
        pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_90,__n_00);
        __n = pvVar3->_M_string_length;
        if (__n == *(size_t *)(in_RCX + 0x80)) {
          if (__n == 0) {
            bVar7 = true;
          }
          else {
            iVar2 = bcmp((pvVar3->_M_dataplus)._M_p,*(void **)(in_RCX + 0x78),__n);
            bVar7 = iVar2 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          pCVar4 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                   ::operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                                 *)this);
          if ((__node_base_ptr)pCVar4[1].tags._M_h._M_rehash_policy._M_next_resize ==
              pCVar4[1].tags._M_h._M_single_bucket) {
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88,
                       ((long)pCVar4[1].tags._M_h._M_buckets -
                        (long)pCVar4[1].comment.value_info_.internal.
                              super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi >> 3) * -0x5555555555555555,&local_c9);
            local_c8._M_dataplus._M_p = (pointer)pCVar4[1].tags._M_h._M_rehash_policy._M_next_resize
            ;
            local_c8._M_string_length = (size_type)pCVar4[1].tags._M_h._M_single_bucket;
            local_c8.field_2._M_allocated_capacity =
                 (size_type)
                 pCVar4[1].child.
                 super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
                 .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
            pCVar4[1].tags._M_h._M_rehash_policy._M_next_resize = local_88;
            pCVar4[1].tags._M_h._M_single_bucket = p_Stack_80;
            pCVar4[1].child.
            super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
            super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
            .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
                 local_78._M_head_impl;
            local_88 = 0;
            p_Stack_80 = (__node_base_ptr)0x0;
            local_78._M_head_impl = (CatalogEntry *)0x0;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
            in_RCX = local_a0;
          }
          this_00 = vector<duckdb::Value,_true>::operator[]
                              ((vector<duckdb::Value,_true> *)
                               &pCVar4[1].tags._M_h._M_rehash_policy._M_next_resize,__n_00);
          bVar6 = true;
          Value::operator=(this_00,local_98);
        }
        if (bVar7) break;
        __n_00 = __n_00 + 1;
        bVar5 = __n_00 < (ulong)((long)((context->config).set_variables._M_h._M_element_count -
                                       (long)(context->config).set_variables._M_h._M_before_begin.
                                             _M_nxt) >> 5);
      } while (bVar5);
    }
    if (!bVar5) {
      this_03 = (BinderException *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"View \"%s\" does not have a column with name \"%s\"","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)&context->interrupted,
                 (long)&((context->registered_state).
                         super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                         .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>.
                        _M_head_impl)->lock + *(long *)&context->interrupted);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)(local_a0 + 0x78),
                 *(long *)(local_a0 + 0x80) + *(long *)(local_a0 + 0x78));
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (this_03,&local_c8,&local_50,&local_70);
      __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (!bVar6) {
      pp_Var1 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry;
      if (pp_Var1 != (_func_int **)0x0) {
        (**(code **)(*pp_Var1 + 8))();
      }
      (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
           (_func_int **)0x0;
    }
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> ViewCatalogEntry::AlterEntry(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);

	// Column comments have a special alter type
	if (info.type == AlterType::SET_COLUMN_COMMENT) {
		auto &comment_on_column_info = info.Cast<SetColumnCommentInfo>();
		auto copied_view = Copy(context);

		for (idx_t i = 0; i < names.size(); i++) {
			const auto &col_name = names[i];
			if (col_name == comment_on_column_info.column_name) {
				auto &copied_view_entry = copied_view->Cast<ViewCatalogEntry>();

				// If vector is empty, we need to initialize it on setting here
				if (copied_view_entry.column_comments.empty()) {
					copied_view_entry.column_comments = vector<Value>(copied_view_entry.types.size());
				}

				copied_view_entry.column_comments[i] = comment_on_column_info.comment_value;
				return copied_view;
			}
		}
		throw BinderException("View \"%s\" does not have a column with name \"%s\"", name,
		                      comment_on_column_info.column_name);
	}

	if (info.type != AlterType::ALTER_VIEW) {
		throw CatalogException("Can only modify view with ALTER VIEW statement");
	}
	auto &view_info = info.Cast<AlterViewInfo>();
	switch (view_info.alter_view_type) {
	case AlterViewType::RENAME_VIEW: {
		auto &rename_info = view_info.Cast<RenameViewInfo>();
		auto copied_view = Copy(context);
		copied_view->name = rename_info.new_view_name;
		return copied_view;
	}
	default:
		throw InternalException("Unrecognized alter view type!");
	}
}